

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ExtensionSet::Extension::Free(Extension *this)

{
  RepeatedField<long> *this_00;
  RepeatedField<unsigned_int> *this_01;
  RepeatedField<unsigned_long> *this_02;
  RepeatedField<float> *this_03;
  RepeatedField<double> *this_04;
  RepeatedField<bool> *this_05;
  RepeatedField<int> *pRVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_06;
  RepeatedPtrField<google::protobuf::MessageLite> *this_07;
  string *this_08;
  CppType CVar2;
  Extension *this_local;
  
  if ((this->is_repeated & 1U) == 0) {
    CVar2 = anon_unknown_29::cpp_type(this->type);
    if (CVar2 == CPPTYPE_STRING) {
      this_08 = (this->field_0).string_value;
      if (this_08 != (string *)0x0) {
        std::__cxx11::string::~string((string *)this_08);
        operator_delete(this_08,0x20);
      }
    }
    else if (CVar2 == CPPTYPE_MESSAGE) {
      if (((byte)this->field_0xa >> 4 & 1) == 0) {
        if ((this->field_0).repeated_string_value !=
            (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x0) {
          (**(code **)((((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_
                      + 8))();
        }
      }
      else if ((this->field_0).repeated_string_value !=
               (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x0) {
        (**(code **)((((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_ +
                    8))();
      }
    }
  }
  else {
    CVar2 = anon_unknown_29::cpp_type(this->type);
    switch(CVar2) {
    case CPPTYPE_INT32:
      pRVar1 = (this->field_0).repeated_int32_value;
      if (pRVar1 != (RepeatedField<int> *)0x0) {
        RepeatedField<int>::~RepeatedField(pRVar1);
        operator_delete(pRVar1,0x10);
      }
      break;
    case CPPTYPE_INT64:
      this_00 = (this->field_0).repeated_int64_value;
      if (this_00 != (RepeatedField<long> *)0x0) {
        RepeatedField<long>::~RepeatedField(this_00);
        operator_delete(this_00,0x10);
      }
      break;
    case CPPTYPE_UINT32:
      this_01 = (this->field_0).repeated_uint32_value;
      if (this_01 != (RepeatedField<unsigned_int> *)0x0) {
        RepeatedField<unsigned_int>::~RepeatedField(this_01);
        operator_delete(this_01,0x10);
      }
      break;
    case CPPTYPE_UINT64:
      this_02 = (this->field_0).repeated_uint64_value;
      if (this_02 != (RepeatedField<unsigned_long> *)0x0) {
        RepeatedField<unsigned_long>::~RepeatedField(this_02);
        operator_delete(this_02,0x10);
      }
      break;
    case CPPTYPE_DOUBLE:
      this_04 = (this->field_0).repeated_double_value;
      if (this_04 != (RepeatedField<double> *)0x0) {
        RepeatedField<double>::~RepeatedField(this_04);
        operator_delete(this_04,0x10);
      }
      break;
    case CPPTYPE_FLOAT:
      this_03 = (this->field_0).repeated_float_value;
      if (this_03 != (RepeatedField<float> *)0x0) {
        RepeatedField<float>::~RepeatedField(this_03);
        operator_delete(this_03,0x10);
      }
      break;
    case CPPTYPE_BOOL:
      this_05 = (this->field_0).repeated_bool_value;
      if (this_05 != (RepeatedField<bool> *)0x0) {
        RepeatedField<bool>::~RepeatedField(this_05);
        operator_delete(this_05,0x10);
      }
      break;
    case CPPTYPE_ENUM:
      pRVar1 = (this->field_0).repeated_int32_value;
      if (pRVar1 != (RepeatedField<int> *)0x0) {
        RepeatedField<int>::~RepeatedField(pRVar1);
        operator_delete(pRVar1,0x10);
      }
      break;
    case CPPTYPE_STRING:
      this_06 = (this->field_0).repeated_string_value;
      if (this_06 !=
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0) {
        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~RepeatedPtrField(this_06);
        operator_delete(this_06,0x18);
      }
      break;
    case CPPTYPE_MESSAGE:
      this_07 = (this->field_0).repeated_message_value;
      if (this_07 != (RepeatedPtrField<google::protobuf::MessageLite> *)0x0) {
        RepeatedPtrField<google::protobuf::MessageLite>::~RepeatedPtrField(this_07);
        operator_delete(this_07,0x18);
      }
    }
  }
  return;
}

Assistant:

void ExtensionSet::Extension::Free() {
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                          \
      case WireFormatLite::CPPTYPE_##UPPERCASE:                    \
        delete repeated_##LOWERCASE##_value;                       \
        break

      HANDLE_TYPE(  INT32,   int32);
      HANDLE_TYPE(  INT64,   int64);
      HANDLE_TYPE( UINT32,  uint32);
      HANDLE_TYPE( UINT64,  uint64);
      HANDLE_TYPE(  FLOAT,   float);
      HANDLE_TYPE( DOUBLE,  double);
      HANDLE_TYPE(   BOOL,    bool);
      HANDLE_TYPE(   ENUM,    enum);
      HANDLE_TYPE( STRING,  string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
  } else {
    switch (cpp_type(type)) {
      case WireFormatLite::CPPTYPE_STRING:
        delete string_value;
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        if (is_lazy) {
          delete lazymessage_value;
        } else {
          delete message_value;
        }
        break;
      default:
        break;
    }
  }
}